

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

string * proto2_unittest::TestAllTypesLite_NestedEnum_Name_abi_cxx11_
                   (TestAllTypesLite_NestedEnum value)

{
  int iVar1;
  string *psVar2;
  
  if (TestAllTypesLite_NestedEnum_Name[abi:cxx11](proto2_unittest::TestAllTypesLite_NestedEnum)::
      kDummy == '\0') {
    iVar1 = __cxa_guard_acquire(&TestAllTypesLite_NestedEnum_Name[abi:cxx11](proto2_unittest::TestAllTypesLite_NestedEnum)
                                 ::kDummy);
    if (iVar1 != 0) {
      TestAllTypesLite_NestedEnum_Name::kDummy =
           google::protobuf::internal::InitializeEnumStrings
                     ((EnumEntry *)TestAllTypesLite_NestedEnum_entries,
                      (int *)TestAllTypesLite_NestedEnum_entries_by_number,3,
                      (ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
                       *)TestAllTypesLite_NestedEnum_strings_abi_cxx11_);
      __cxa_guard_release(&TestAllTypesLite_NestedEnum_Name[abi:cxx11](proto2_unittest::TestAllTypesLite_NestedEnum)
                           ::kDummy);
    }
  }
  iVar1 = google::protobuf::internal::LookUpEnumName
                    ((EnumEntry *)TestAllTypesLite_NestedEnum_entries,
                     (int *)TestAllTypesLite_NestedEnum_entries_by_number,3,value);
  if (iVar1 == -1) {
    google::protobuf::internal::InitProtobufDefaults();
    psVar2 = (string *)&google::protobuf::internal::fixed_address_empty_string;
  }
  else {
    psVar2 = (string *)(TestAllTypesLite_NestedEnum_strings_abi_cxx11_ + (long)iVar1 * 0x20);
  }
  return psVar2;
}

Assistant:

const ::std::string& TestAllTypesLite_NestedEnum_Name(TestAllTypesLite_NestedEnum value) {
  static const bool kDummy = ::google::protobuf::internal::InitializeEnumStrings(
      TestAllTypesLite_NestedEnum_entries, TestAllTypesLite_NestedEnum_entries_by_number, 3,
      TestAllTypesLite_NestedEnum_strings);
  (void)kDummy;

  int idx = ::google::protobuf::internal::LookUpEnumName(TestAllTypesLite_NestedEnum_entries,
                                  TestAllTypesLite_NestedEnum_entries_by_number,
                                  3, value);
  return idx == -1 ? ::google::protobuf::internal::GetEmptyString() : TestAllTypesLite_NestedEnum_strings[idx].get();
}